

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,SizeType *range)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  Range *pRVar4;
  SizeType r_1;
  SizeType r;
  uint codepoint;
  SizeType current;
  SizeType start;
  int step;
  bool negate;
  bool isBegin;
  SizeType *range_local;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  *ds_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  start._3_1_ = 1;
  start._2_1_ = 0;
  current = 0;
  codepoint = 0xffffffff;
  r = 0xffffffff;
  _step = range;
  range_local = (SizeType *)ds;
  ds_local = (DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              *)this;
LAB_00171ea9:
  do {
    while( true ) {
      while( true ) {
        r_1 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              ::Take((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                      *)range_local);
        if (r_1 == 0) {
          return false;
        }
        if (((start._3_1_ & 1) == 0) || (start._3_1_ = 0, r_1 != 0x5e)) break;
        start._2_1_ = 1;
      }
      if (r_1 == 0x5c) {
        uVar3 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                ::Peek((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                        *)range_local);
        if (uVar3 == 0x62) {
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          ::Take((DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                  *)range_local);
          r_1 = 8;
        }
        else {
          bVar1 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                            (this,(DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                                   *)range_local,&r_1);
          if (!bVar1) {
            return false;
          }
        }
      }
      else if (r_1 == 0x5d) {
        if (codepoint == 0xffffffff) {
          return false;
        }
        if (current == 2) {
          SVar2 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewRange
                            ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                             0x2d);
          if (r == 0xffffffff) {
            __assert_fail("current != kRegexInvalidRange",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                          ,0x1f8,
                          "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                         );
          }
          pRVar4 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                             ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,r
                             );
          pRVar4->next = SVar2;
        }
        if ((start._2_1_ & 1) != 0) {
          pRVar4 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                             ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                              codepoint);
          pRVar4->start = pRVar4->start | 0x80000000;
        }
        *_step = codepoint;
        return true;
      }
      SVar2 = r_1;
      if (current != 0) break;
LAB_00171ff6:
      SVar2 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewRange
                        ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,r_1);
      if (r != 0xffffffff) {
        pRVar4 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                           ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,r);
        pRVar4->next = SVar2;
      }
      if (codepoint == 0xffffffff) {
        codepoint = SVar2;
      }
      current = 1;
      r = SVar2;
    }
    if (current == 1) {
      if (r_1 != 0x2d) goto LAB_00171ff6;
      current = 2;
      goto LAB_00171ea9;
    }
    if (current != 2) {
      __assert_fail("step == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0x221,
                    "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                   );
    }
    pRVar4 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                       ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,r);
    pRVar4->end = SVar2;
    current = 0;
  } while( true );
}

Assistant:

bool ParseRange(DecodedStream<InputStream, Encoding>& ds, SizeType* range) {
        bool isBegin = true;
        bool negate = false;
        int step = 0;
        SizeType start = kRegexInvalidRange;
        SizeType current = kRegexInvalidRange;
        unsigned codepoint;
        while ((codepoint = ds.Take()) != 0) {
            if (isBegin) {
                isBegin = false;
                if (codepoint == '^') {
                    negate = true;
                    continue;
                }
            }

            switch (codepoint) {
            case ']':
                if (start == kRegexInvalidRange)
                    return false;   // Error: nothing inside []
                if (step == 2) { // Add trailing '-'
                    SizeType r = NewRange('-');
                    RAPIDJSON_ASSERT(current != kRegexInvalidRange);
                    GetRange(current).next = r;
                }
                if (negate)
                    GetRange(start).start |= kRangeNegationFlag;
                *range = start;
                return true;

            case '\\':
                if (ds.Peek() == 'b') {
                    ds.Take();
                    codepoint = 0x0008; // Escape backspace character
                }
                else if (!CharacterEscape(ds, &codepoint))
                    return false;
                // fall through to default
                RAPIDJSON_DELIBERATE_FALLTHROUGH;

            default:
                switch (step) {
                case 1:
                    if (codepoint == '-') {
                        step++;
                        break;
                    }
                    // fall through to step 0 for other characters
                    RAPIDJSON_DELIBERATE_FALLTHROUGH;

                case 0:
                    {
                        SizeType r = NewRange(codepoint);
                        if (current != kRegexInvalidRange)
                            GetRange(current).next = r;
                        if (start == kRegexInvalidRange)
                            start = r;
                        current = r;
                    }
                    step = 1;
                    break;

                default:
                    RAPIDJSON_ASSERT(step == 2);
                    GetRange(current).end = codepoint;
                    step = 0;
                }
            }
        }
        return false;
    }